

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O2

void __thiscall QWingedEdge::QWingedEdge(QWingedEdge *this,QPainterPath *subject,QPainterPath *clip)

{
  QPathSegments *this_00;
  int iVar1;
  
  iVar1 = QPainterPath::elementCount(subject);
  QDataBuffer<QPathEdge>::QDataBuffer(&this->m_edges,(long)iVar1);
  iVar1 = QPainterPath::elementCount(subject);
  QDataBuffer<QPathVertex>::QDataBuffer(&this->m_vertices,(long)iVar1);
  (this->m_splitPoints).d.d = (Data *)0x0;
  (this->m_splitPoints).d.ptr = (double *)0x0;
  (this->m_splitPoints).d.size = 0;
  this_00 = &this->m_segments;
  iVar1 = QPainterPath::elementCount(subject);
  QPathSegments::QPathSegments(this_00,iVar1);
  QPathSegments::setPath(this_00,subject);
  QPathSegments::addPath(this_00,clip);
  intersectAndAdd(this);
  return;
}

Assistant:

QWingedEdge::QWingedEdge(const QPainterPath &subject, const QPainterPath &clip) :
    m_edges(subject.elementCount()),
    m_vertices(subject.elementCount()),
    m_segments(subject.elementCount())
{
    m_segments.setPath(subject);
    m_segments.addPath(clip);

    intersectAndAdd();
}